

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateMembers
          (WrapperFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "private static readonly pb::FieldCodec<$type_name$> _single_$name$_codec = ");
  (*(this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this,printer);
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     ";\nprivate $type_name$ $name$_;\n");
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $name$_; }\n  set {\n    $name$_ = value;\n  }\n}\n"
                    );
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
        variables_,
        "private static readonly pb::FieldCodec<$type_name$> _single_$name$_codec = ");
  GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ";\n"
    "private $type_name$ $name$_;\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $name$_; }\n"
    "  set {\n"
    "    $name$_ = value;\n"
    "  }\n"
    "}\n");
}